

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryPropertyDescriptor.h
# Opt level: O2

bool __thiscall
Js::DictionaryPropertyDescriptor<int>::SanityCheckFixedBits(DictionaryPropertyDescriptor<int> *this)

{
  bool bVar1;
  
  bVar1 = true;
  if ((this->flags & (UsedAsFixed|IsFixed)) != None) {
    if ((this->Attributes & 8) == 0) {
      if ((this->Data == -1) && (this->Getter == -1)) {
        bVar1 = this->Setter != -1;
      }
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool SanityCheckFixedBits()
        {
            return
                (!GetIsFixed() && !GetUsedAsFixed()) ||
                (!(this->Attributes & PropertyDeleted) && (this->Data != NoSlots || this->Getter != NoSlots || this->Setter != NoSlots));
        }